

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_part(REF_CELL ref_cell,REF_NODE ref_node,REF_INT cell,REF_INT *output_part)

{
  uint uVar1;
  REF_INT cell_node;
  int local_2c;
  
  *output_part = -1;
  uVar1 = ref_cell_part_cell_node(ref_cell,ref_node,cell,&local_2c);
  if (uVar1 == 0) {
    if (local_2c == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x395,
             "ref_cell_part","cell_node is empty?");
      uVar1 = 1;
    }
    else {
      *output_part = ref_node->part[ref_cell->c2n[cell * ref_cell->size_per + local_2c]];
      uVar1 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x394,
           "ref_cell_part",(ulong)uVar1,"part_cell_node");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_part(REF_CELL ref_cell, REF_NODE ref_node,
                                 REF_INT cell, REF_INT *output_part) {
  REF_INT cell_node;
  *output_part = REF_EMPTY;
  RSS(ref_cell_part_cell_node(ref_cell, ref_node, cell, &cell_node),
      "part_cell_node");
  RUS(REF_EMPTY, cell_node, "cell_node is empty?");
  *output_part =
      ref_node_part(ref_node, ref_cell_c2n(ref_cell, cell_node, cell));
  return REF_SUCCESS;
}